

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void getNameAndInt(int argc,char **argv,int *i,int part,SetAttrVector *attrs)

{
  int iVar1;
  char *__s;
  long lVar2;
  Attribute *pAVar3;
  invalid_argument *this;
  allocator<char> local_75;
  int j;
  string local_70 [32];
  SetAttr local_50;
  
  iVar1 = *i;
  if (iVar1 <= argc + -3) {
    __s = argv[(long)iVar1 + 1];
    lVar2 = strtol(argv[(long)iVar1 + 2],(char **)0x0,0);
    j = (int)lVar2;
    std::__cxx11::string::string<std::allocator<char>>(local_70,__s,&local_75);
    pAVar3 = (Attribute *)operator_new(0x10);
    Imf_3_4::TypedAttribute<int>::TypedAttribute((int *)pAVar3);
    std::__cxx11::string::string((string *)&local_50,local_70);
    local_50.part = part;
    local_50.attr = pAVar3;
    std::vector<SetAttr,_std::allocator<SetAttr>_>::emplace_back<SetAttr>(attrs,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string(local_70);
    *i = *i + 3;
    return;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"Expected a name and an integer");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void
getNameAndInt (int argc, char** argv, int& i, int part, SetAttrVector& attrs)
{
    if (i > argc - 3) throw invalid_argument ("Expected a name and an integer");

    const char* attrName = argv[i + 1];
    int         j        = strtol (argv[i + 2], 0, 0);
    attrs.push_back (SetAttr (attrName, part, new IntAttribute (j)));
    i += 3;
}